

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

void list_genocided(char defquery,boolean ask)

{
  nh_menuitem *pnVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  permonst *pm;
  permonst *pm_00;
  menulist menu;
  char buf [256];
  menulist local_148;
  char local_138 [7];
  undefined4 auStack_131 [64];
  
  lVar3 = 0x30690e;
  uVar10 = 0;
  lVar7 = 2;
  uVar9 = 0;
  do {
    uVar10 = uVar10 + (((&mvitals[0].born)[lVar7] >> 1 & 1) != 0);
    if (((&mvitals[0].born)[lVar7] & 3) != 0) {
      uVar9 = uVar9 + ((*(byte *)(lVar3 + 1) & 0x10) == 0);
    }
    lVar7 = lVar7 + 3;
    lVar3 = lVar3 + 0x40;
  } while (lVar7 != 0x4bb);
  if (uVar10 != 0 || uVar9 != 0) {
    if (ask != '\0') {
      pcVar4 = "Do you want a list of species genocided?";
      if (uVar9 != 0) {
        pcVar4 = "Do you want a list of species genocided or extinct?";
      }
      defquery = yn_function(pcVar4,"ynq",defquery);
    }
    if (defquery == 'y') {
      init_menulist(&local_148);
      lVar3 = 2;
      pm_00 = mons;
      lVar7 = 0;
      do {
        if (((&mvitals[0].born)[lVar3] & 2) == 0) {
          if ((((&mvitals[0].born)[lVar3] & 1) != 0) && (pm = pm_00, (pm_00->geno & 0x1000) == 0)) {
LAB_00197379:
            pcVar4 = mons_mname(pm);
            pcVar4 = makeplural(pcVar4);
            strcpy(local_138,pcVar4);
            goto LAB_00197393;
          }
        }
        else {
          pm = mons + lVar7;
          if ((lVar3 == 0x362) || ((pm_00->geno & 0x1000) == 0)) goto LAB_00197379;
          pcVar4 = "the ";
          if ((pm_00->mflags2 & 0x80000) == 0) {
            pcVar4 = "";
          }
          pcVar5 = mons_mname(pm_00);
          sprintf(local_138,"%s%s",pcVar4,pcVar5);
LAB_00197393:
          if (((&mvitals[0].born)[lVar3] & 2) == 0) {
            sVar6 = strlen(local_138);
            builtin_strncpy(local_138 + sVar6," (extinc",8);
            *(undefined4 *)((long)auStack_131 + sVar6) = 0x297463;
          }
          lVar8 = (long)local_148.size;
          if (local_148.size <= local_148.icount) {
            local_148.size = local_148.size * 2;
            local_148.items = (nh_menuitem *)realloc(local_148.items,lVar8 * 0x218);
          }
          pnVar1 = local_148.items + local_148.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_148.icount = local_148.icount + 1;
        }
        lVar7 = lVar7 + 1;
        pm_00 = pm_00 + 1;
        lVar3 = lVar3 + 3;
      } while (lVar3 != 0x4bb);
      if ((0 < (int)uVar9) && (bVar2 = aprilfoolsday(), bVar2 != '\0')) {
        lVar3 = (long)local_148.size;
        if (local_148.size <= local_148.icount) {
          local_148.size = local_148.size * 2;
          local_148.items = (nh_menuitem *)realloc(local_148.items,lVar3 * 0x218);
        }
        local_148.items[local_148.icount].id = 0;
        local_148.items[local_148.icount].role = MI_TEXT;
        local_148.items[local_148.icount].accel = '\0';
        local_148.items[local_148.icount].group_accel = '\0';
        local_148.items[local_148.icount].selected = '\0';
        builtin_strncpy(local_148.items[local_148.icount].caption,"ammonites (extin",0x10);
        builtin_strncpy(local_148.items[local_148.icount].caption + 0x10,"ct)",4);
        local_148.icount = local_148.icount + 1;
        uVar9 = uVar9 + 1;
      }
      lVar3 = (long)local_148.size;
      if (local_148.size <= local_148.icount) {
        local_148.size = local_148.size * 2;
        local_148.items = (nh_menuitem *)realloc(local_148.items,lVar3 * 0x218);
      }
      lVar3 = (long)local_148.icount;
      local_148.items[lVar3].accel = '\0';
      local_148.items[lVar3].group_accel = '\0';
      local_148.items[lVar3].selected = '\0';
      local_148.items[lVar3].caption[0] = '\0';
      local_148.items[lVar3].id = 0;
      local_148.items[lVar3].role = MI_TEXT;
      local_148.icount = local_148.icount + 1;
      sprintf(local_138,"%d species genocided.",(ulong)uVar10);
      if (uVar10 != 0) {
        lVar3 = (long)local_148.size;
        if (local_148.size <= local_148.icount) {
          local_148.size = local_148.size * 2;
          local_148.items = (nh_menuitem *)realloc(local_148.items,lVar3 * 0x218);
        }
        pnVar1 = local_148.items + local_148.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_138);
        local_148.icount = local_148.icount + 1;
      }
      sprintf(local_138,"%d species extinct.",(ulong)uVar9);
      if (uVar9 == 0) {
        pcVar4 = "Genocided species:";
      }
      else {
        lVar3 = (long)local_148.size;
        if (local_148.size <= local_148.icount) {
          local_148.size = local_148.size * 2;
          local_148.items = (nh_menuitem *)realloc(local_148.items,lVar3 * 0x218);
        }
        pnVar1 = local_148.items + local_148.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_138);
        local_148.icount = local_148.icount + 1;
        pcVar4 = "Genocided or extinct species:";
      }
      display_menu(local_148.items,local_148.icount,pcVar4,0,(int *)0x0);
      free(local_148.items);
    }
    else if (defquery == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
  }
  return;
}

Assistant:

void list_genocided(char defquery, boolean ask)
{
    int i;
    int ngenocided, nextincted;
    char c, *query, *title;
    char buf[BUFSZ];
    struct menulist menu;

    ngenocided = nextincted = 0;
    for (i = LOW_PM; i < NUMMONS; ++i) {
	if (mvitals[i].mvflags & G_GENOD)
	    ngenocided++;
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    nextincted++;
    }

    /* genocided species list */
    if (ngenocided != 0 || nextincted != 0) {
	query = nextincted ? "Do you want a list of species genocided or extinct?" :
	                     "Do you want a list of species genocided?";
	c = ask ? yn_function(query, ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);
	    for (i = LOW_PM; i < NUMMONS; i++)
		if ((mvitals[i].mvflags & G_GENOD) ||
		    ((mvitals[i].mvflags & G_EXTINCT) && !(mons[i].geno & G_UNIQ))) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST)
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "" : "the ",
				mons_mname(&mons[i]));
		    else
			strcpy(buf, makeplural(mons_mname(&mons[i])));
		
		    if( !(mvitals[i].mvflags & G_GENOD) )
			strcat(buf, " (extinct)");
		    add_menutext(&menu, buf);
		}

	    if (nextincted > 0 && aprilfoolsday()) {
		add_menutext(&menu, "ammonites (extinct)");
		nextincted++;
	    }

	    add_menutext(&menu, "");
	    sprintf(buf, "%d species genocided.", ngenocided);
	    if (ngenocided)
		add_menutext(&menu, buf);
	    sprintf(buf, "%d species extinct.", nextincted);
	    if (nextincted)
		add_menutext(&menu, buf);

	    title = nextincted ? "Genocided or extinct species:" :
	                         "Genocided species:";
	    display_menu(menu.items, menu.icount, title, PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}